

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  pointer puVar2;
  pointer puVar3;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  uint32_t uVar6;
  uintptr_t *puVar7;
  Expression *pEVar8;
  RefFunc *target;
  CallRef *pCVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  int iVar10;
  Type *pTVar11;
  bool isReturn;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar12;
  Type local_78;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Iterator __begin1;
  
  iVar10 = -1;
  while (iVar10 = iVar10 + 1, iVar10 != (this->fuzzParams->super_FuzzParams).TRIES) {
    pMVar1 = this->wasm;
    puVar2 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 == puVar3) break;
    uVar6 = Random::upTo(&this->random,(uint32_t)((ulong)((long)puVar3 - (long)puVar2) >> 3));
    _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (pMVar1->functions).
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
    if ((type.id == 1) && (((this->wasm->features).features & 0x80) != 0)) {
      wasm::HeapType::getSignature();
      wasm::HeapType::getSignature();
      isReturn = extraout_RDX == extraout_RDX_00;
    }
    else {
      isReturn = false;
    }
    wasm::HeapType::getSignature();
    if ((isReturn != false) || (extraout_RDX_01 == type.id)) {
      auStack_68 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.id = wasm::HeapType::getSignature();
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&local_78;
      PVar12 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_78);
      pTVar11 = &local_78;
      for (; PVar5.index = (size_t)__begin1.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar5.parent = pTVar11, PVar12 != PVar5;
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        puVar7 = (uintptr_t *)
                 wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_70 = make(this,(Type)*puVar7);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   &local_70);
        pTVar11 = (Type *)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      target = Builder::makeRefFunc
                         (&this->builder,
                          (Name)*(string_view *)
                                 _Var4.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                          (HeapType)
                          *(uintptr_t *)
                           ((long)_Var4.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                           0x38));
      pCVar9 = Builder::
               makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(Expression *)target,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68,type,isReturn);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68
                );
      return (Expression *)pCVar9;
    }
  }
  pEVar8 = makeTrivial(this,type);
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  decltype(fuzzParams->TRIES) i = 0;
  while (1) {
    if (i == fuzzParams->TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}